

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SqlExec(int *pRC,Fts3Table *p,int eStmt,sqlite3_value **apVal)

{
  int local_34;
  sqlite3_stmt *psStack_30;
  int rc;
  sqlite3_stmt *pStmt;
  sqlite3_value **apVal_local;
  Fts3Table *pFStack_18;
  int eStmt_local;
  Fts3Table *p_local;
  int *pRC_local;
  
  if (*pRC == 0) {
    pStmt = (sqlite3_stmt *)apVal;
    apVal_local._4_4_ = eStmt;
    pFStack_18 = p;
    p_local = (Fts3Table *)pRC;
    local_34 = fts3SqlStmt(p,eStmt,&stack0xffffffffffffffd0,apVal);
    if (local_34 == 0) {
      sqlite3_step(psStack_30);
      local_34 = sqlite3_reset(psStack_30);
    }
    *(int *)&(p_local->base).pModule = local_34;
  }
  return;
}

Assistant:

static void fts3SqlExec(
  int *pRC,                /* Result code */
  Fts3Table *p,            /* The FTS3 table */
  int eStmt,               /* Index of statement to evaluate */
  sqlite3_value **apVal    /* Parameters to bind */
){
  sqlite3_stmt *pStmt;
  int rc;
  if( *pRC ) return;
  rc = fts3SqlStmt(p, eStmt, &pStmt, apVal); 
  if( rc==SQLITE_OK ){
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
  }
  *pRC = rc;
}